

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O3

void ssh_free(Backend *be)

{
  Ssh *ssh;
  char cVar1;
  _Bool _Var2;
  
  ssh = (Ssh *)(be + -3);
  ssh_shutdown(ssh);
  _Var2 = is_tempseat((Seat *)be[-3].interactor);
  if (_Var2) {
    tempseat_free((Seat *)be[-3].interactor);
  }
  conf_free((Conf *)be[-2].vt);
  if ((ssh_sharing_state *)be[4].interactor != (ssh_sharing_state *)0x0) {
    sharestate_free((ssh_sharing_state *)be[4].interactor);
  }
  safefree(be[7].interactor);
  safefree(be[8].interactor);
  safefree(be[3].interactor);
  if (be[6].interactor != (Interactor *)0x0) {
    (*(be[6].vt)->sendbuffer)((Backend *)be[6].vt);
  }
  if (be[7].vt != (BackendVtable *)0x0) {
    (*(be[6].vt)->connected)((Backend *)be[6].vt);
  }
  if (be[5].interactor != (Interactor *)0x0) {
    ssh_gss_cleanup((ssh_gss_liblist *)be[5].interactor);
  }
  safefree(be[0x1c].vt);
  safefree(be[9].vt);
  delete_callbacks_for_context(ssh);
  cVar1 = *(char *)&be[0x1c].interactor;
  safefree(ssh);
  if (cVar1 == '\x01') {
    random_unref();
    return;
  }
  return;
}

Assistant:

static void ssh_free(Backend *be)
{
    Ssh *ssh = container_of(be, Ssh, backend);
    bool need_random_unref;

    ssh_shutdown(ssh);

    if (is_tempseat(ssh->seat))
        tempseat_free(ssh->seat);

    conf_free(ssh->conf);
    if (ssh->connshare)
        sharestate_free(ssh->connshare);
    sfree(ssh->savedhost);
    sfree(ssh->fullhostname);
    sfree(ssh->specials);

#ifndef NO_GSSAPI
    if (ssh->gss_state.srv_name)
        ssh->gss_state.lib->release_name(
            ssh->gss_state.lib, &ssh->gss_state.srv_name);
    if (ssh->gss_state.ctx != NULL)
        ssh->gss_state.lib->release_cred(
            ssh->gss_state.lib, &ssh->gss_state.ctx);
    if (ssh->gss_state.libs)
        ssh_gss_cleanup(ssh->gss_state.libs);
#endif

    sfree(ssh->deferred_abort_message);
    sfree(ssh->description);

    delete_callbacks_for_context(ssh); /* likely to catch ic_out_raw */

    need_random_unref = ssh->need_random_unref;
    sfree(ssh);

    if (need_random_unref)
        random_unref();
}